

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_numsub_negk(jit_State *J)

{
  TRef TVar1;
  uint64_t in_RDI;
  bool bVar2;
  TValue tv;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  bVar2 = (*(byte *)(in_RDI + 0xa4) & 0x40) == 0;
  if (bVar2) {
    *(undefined2 *)(in_RDI + 0x9a) = *(undefined2 *)(in_RDI + 0xa0);
    TVar1 = lj_ir_knum_u64((jit_State *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
    *(short *)(in_RDI + 0x98) = (short)TVar1;
  }
  return (uint)bVar2;
}

Assistant:

LJFOLD(SUB NEG KNUM)
LJFOLDF(simplify_numsub_negk)
{
  PHIBARRIER(fleft);
  fins->op2 = fleft->op1;  /* (-x) - k ==> (-k) - x */
  fins->op1 = (IRRef1)lj_ir_knum(J, -knumright);
  return RETRYFOLD;
}